

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer_interface.cc
# Opt level: O0

void __thiscall
sentencepiece::MultiFileSentenceIterator::MultiFileSentenceIterator
          (MultiFileSentenceIterator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  MultiFileSentenceIterator *this_local;
  
  SentenceIterator::SentenceIterator(&this->super_SentenceIterator);
  (this->super_SentenceIterator)._vptr_SentenceIterator =
       (_func_int **)&PTR__MultiFileSentenceIterator_003eb6d0;
  this->read_done_ = false;
  this->file_index_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->files_,files);
  std::__cxx11::string::string((string *)&this->value_);
  std::
  unique_ptr<sentencepiece::filesystem::ReadableFile,std::default_delete<sentencepiece::filesystem::ReadableFile>>
  ::unique_ptr<std::default_delete<sentencepiece::filesystem::ReadableFile>,void>
            ((unique_ptr<sentencepiece::filesystem::ReadableFile,std::default_delete<sentencepiece::filesystem::ReadableFile>>
              *)&this->fp_);
  (*(this->super_SentenceIterator)._vptr_SentenceIterator[3])();
  return;
}

Assistant:

MultiFileSentenceIterator::MultiFileSentenceIterator(
    const std::vector<std::string> &files)
    : files_(files) {
  Next();
}